

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar6;
  int *piVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  uint count_00;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong __nmemb;
  uv_cpu_info_t *puVar14;
  uint64_t user;
  uint local_474;
  uv_cpu_info_t **local_470;
  uint *local_468;
  uint64_t irq;
  uint64_t idle;
  uint64_t sys;
  uint64_t nice;
  uint64_t dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  __stream = (FILE *)uv__open_file("/proc/stat");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    return -*piVar7;
  }
  pcVar5 = fgets(buf,0x400,__stream);
  if ((pcVar5 != (char *)0x0) && (pcVar5 = fgets(buf,0x400,__stream), pcVar5 != (char *)0x0)) {
    count_00 = 0;
    do {
      if (buf[2] != 'u' || buf._0_2_ != 0x7063) break;
      count_00 = count_00 + 1;
      pcVar5 = fgets(buf,0x400,__stream);
    } while (pcVar5 != (char *)0x0);
    if (count_00 != 0) {
      __nmemb = (ulong)count_00;
      local_470 = cpu_infos;
      local_468 = (uint *)count;
      cpu_infos_00 = (uv_cpu_info_t *)uv__calloc(__nmemb,0x38);
      if (cpu_infos_00 == (uv_cpu_info_t *)0x0) {
        iVar3 = -0xc;
        goto LAB_00245f8d;
      }
      pFVar6 = (FILE *)uv__open_file("/proc/cpuinfo");
      if (pFVar6 == (FILE *)0x0) {
        piVar7 = __errno_location();
        if (*piVar7 != 0) {
          iVar3 = -*piVar7;
          goto LAB_00246291;
        }
      }
      else {
        pcVar5 = fgets(buf,0x400,pFVar6);
        if (pcVar5 == (char *)0x0) {
          fclose(pFVar6);
LAB_00245ff4:
          pcVar5 = "unknown";
          uVar11 = 0;
        }
        else {
          uVar10 = 0;
          uVar13 = 0;
          do {
            uVar10 = uVar10 & 0xffffffff;
            while( true ) {
              while ((uVar10 < __nmemb &&
                     (CONCAT26(buf._11_2_,CONCAT33(buf._8_3_,buf._5_3_)) == 0x203a09656d616e20 &&
                      CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) ==
                      0x616e206c65646f6d))) {
                sVar8 = strlen(buf + 0xd);
                pcVar5 = uv__strndup(buf + 0xd,sVar8 - 1);
                if (pcVar5 == (char *)0x0) {
                  fclose(pFVar6);
                  goto LAB_0024628b;
                }
                uVar11 = uVar10 + 1;
                cpu_infos_00[uVar10].model = pcVar5;
                pcVar5 = fgets(buf,0x400,pFVar6);
                uVar10 = uVar11;
                if (pcVar5 == (char *)0x0) {
                  fclose(pFVar6);
                  goto LAB_00245f74;
                }
              }
              if ((uVar13 < __nmemb) &&
                 (CONCAT35(buf._8_3_,CONCAT41(buf._4_4_,buf[3])) == 0x203a09097a484d20 &&
                  CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) ==
                  0x97a484d20757063)) break;
              pcVar5 = fgets(buf,0x400,pFVar6);
              if (pcVar5 == (char *)0x0) goto LAB_00245f63;
            }
            iVar3 = atoi(buf + 0xb);
            cpu_infos_00[uVar13].speed = iVar3;
            pcVar5 = fgets(buf,0x400,pFVar6);
            uVar13 = uVar13 + 1;
          } while (pcVar5 != (char *)0x0);
LAB_00245f63:
          fclose(pFVar6);
          uVar11 = uVar10;
          if (uVar10 == 0) goto LAB_00245ff4;
LAB_00245f74:
          pcVar5 = cpu_infos_00[(int)uVar11 - 1].model;
        }
        if ((uint)uVar11 < count_00) {
          puVar14 = cpu_infos_00 + (uVar11 & 0xffffffff);
          lVar12 = __nmemb - (uVar11 & 0xffffffff);
          do {
            sVar8 = strlen(pcVar5);
            pcVar9 = uv__strndup(pcVar5,sVar8);
            if (pcVar9 == (char *)0x0) goto LAB_0024628b;
            puVar14->model = pcVar9;
            puVar14 = puVar14 + 1;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
        }
      }
      uVar10 = sysconf(2);
      if ((int)uVar10 == 0) {
        __assert_fail("ticks != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x21c,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
      }
      if ((int)uVar10 == -1) {
        __assert_fail("ticks != (unsigned int) -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x21b,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
      }
      uVar10 = 1000 / (uVar10 & 0xffffffff);
      rewind(__stream);
      pcVar5 = fgets(buf,0x400,__stream);
      if (pcVar5 == (char *)0x0) goto LAB_002462ae;
      pcVar5 = fgets(buf,0x400,__stream);
      if (pcVar5 == (char *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar11 = 0;
        while (uVar13 = uVar11, buf[2] == 'u' && buf._0_2_ == 0x7063) {
          iVar3 = __isoc99_sscanf(buf,"cpu%u ",&local_474);
          if (iVar3 != 1) {
            __assert_fail("r == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                          ,0x231,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
          }
          pcVar5 = buf + 4;
          uVar4 = local_474;
          do {
            pcVar5 = pcVar5 + 1;
            bVar1 = 9 < uVar4;
            uVar4 = uVar4 / 10;
          } while (bVar1);
          iVar3 = __isoc99_sscanf(pcVar5,"%lu %lu %lu%lu %lu %lu",&user,&nice,&sys,&idle,&dummy,&irq
                                 );
          if (iVar3 != 6) goto LAB_002462ae;
          uVar13 = uVar11 + 1;
          cpu_infos_00[uVar11].cpu_times.user = user * uVar10;
          cpu_infos_00[uVar11].cpu_times.nice = nice * uVar10;
          cpu_infos_00[uVar11].cpu_times.sys = sys * uVar10;
          cpu_infos_00[uVar11].cpu_times.idle = idle * uVar10;
          cpu_infos_00[uVar11].cpu_times.irq = irq * uVar10;
          pcVar5 = fgets(buf,0x400,__stream);
          if ((pcVar5 == (char *)0x0) || (uVar11 = uVar13, __nmemb <= uVar13)) break;
        }
      }
      if (uVar13 != __nmemb) {
        __assert_fail("num == numcpus",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x24e,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
      }
      if (cpu_infos_00->speed == 0) {
        piVar7 = &cpu_infos_00->speed;
        uVar10 = 0;
        do {
          snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                   uVar10 & 0xffffffff);
          pFVar6 = (FILE *)uv__open_file(buf);
          iVar3 = 0;
          if (pFVar6 != (FILE *)0x0) {
            iVar3 = __isoc99_fscanf(pFVar6,"%lu",&user);
            if (iVar3 != 1) {
              user = 0;
            }
            fclose(pFVar6);
            iVar3 = (int)(user / 1000);
          }
          *piVar7 = iVar3;
          uVar10 = uVar10 + 1;
          piVar7 = piVar7 + 0xe;
        } while (__nmemb != uVar10);
      }
      *local_470 = cpu_infos_00;
      *local_468 = count_00;
      iVar3 = 0;
      goto LAB_00245f8d;
    }
  }
  iVar3 = -5;
LAB_00245f8d:
  iVar2 = fclose(__stream);
  if (iVar2 != 0) {
    piVar7 = __errno_location();
    if ((*piVar7 != 4) && (*piVar7 != 0x73)) {
LAB_002462ae:
      abort();
    }
  }
  return iVar3;
LAB_0024628b:
  iVar3 = -0xc;
LAB_00246291:
  uv_free_cpu_info(cpu_infos_00,count_00);
  goto LAB_00245f8d;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return UV__ERR(errno);

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = UV_ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}